

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_aggregate.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalAggregate *op)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *aggregates;
  vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
  *this_00;
  PhysicalOperatorType PVar1;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar2;
  ClientContext *pCVar3;
  pointer puVar4;
  unsigned_long uVar5;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar6;
  bool bVar7;
  TablePartitionInfo TVar8;
  reference this_01;
  type op_00;
  PhysicalOperator *pPVar9;
  pointer pEVar10;
  BoundAggregateExpression *pBVar11;
  BoundReferenceExpression *pBVar12;
  PhysicalProjection *pPVar13;
  reference pvVar14;
  reference pvVar15;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *this_02;
  type pBVar16;
  type pBVar17;
  pointer puVar18;
  ClientConfig *pCVar19;
  PhysicalTableScan *pPVar20;
  reference pvVar21;
  reference pvVar22;
  InternalException *this_03;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_04;
  uint *result;
  unsigned_long *partition_col;
  pointer puVar23;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression;
  LogicalType *other;
  pointer puVar24;
  hugeint_t hVar25;
  hugeint_t input;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range1;
  ulong local_148;
  value_type local_140;
  PhysicalTableScan *local_138;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range1_1;
  vector<unsigned_long,_true> partition_columns;
  vector<unsigned_long,_true> base_columns;
  vector<unsigned_long,_true> required_bits;
  unsigned_long col_idx;
  element_type *local_80;
  LogicalType local_48;
  
  this_01 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&(op->super_LogicalOperator).children,0);
  op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
          operator*(this_01);
  pPVar9 = CreatePlan(this,op_00);
  aggregates = &(op->super_LogicalOperator).expressions;
  __range1_1 = &op->groups;
  pPVar9 = ExtractAggregateExpressions(this,pPVar9,aggregates,__range1_1);
  puVar2 = (op->super_LogicalOperator).expressions.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar6 = (op->super_LogicalOperator).expressions.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_140._M_data = pPVar9;
  do {
    this_04 = puVar6;
    if (this_04 == puVar2) break;
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_04);
    pBVar11 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&pEVar10->super_BaseExpression)
    ;
    puVar6 = this_04 + 1;
  } while ((pBVar11->function).simple_update != (aggregate_simple_update_t)0x0);
  if (((op->groups).
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (op->groups).
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((ulong)(((long)(op->grouping_sets).
                     super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     .
                     super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(op->grouping_sets).
                    super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    .
                    super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x30) < 2)) {
    if (this_04 == puVar2) {
      pPVar9 = Make<duckdb::PhysicalUngroupedAggregate,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                         (this,&(op->super_LogicalOperator).types,aggregates,
                          &(op->super_LogicalOperator).estimated_cardinality);
    }
    else {
      pPVar9 = Make<duckdb::PhysicalHashAggregate,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                         (this,this->context,&(op->super_LogicalOperator).types,aggregates,
                          &(op->super_LogicalOperator).estimated_cardinality);
    }
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    ::push_back(&(pPVar9->children).
                 super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                ,&local_140);
    return pPVar9;
  }
  partition_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  required_bits.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  partition_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  partition_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  required_bits.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  required_bits.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (((this_04 == puVar2) &&
      ((ulong)(((long)(op->grouping_sets).
                      super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                      .
                      super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(op->grouping_sets).
                     super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     .
                     super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x30) < 2)) &&
     ((op->grouping_functions).
      super_vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
      .
      super__Vector_base<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (op->grouping_functions).
      super_vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
      .
      super__Vector_base<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pCVar3 = this->context;
    puVar24 = (op->super_LogicalOperator).expressions.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (op->super_LogicalOperator).expressions.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (puVar24 == puVar4) {
        puVar24 = (op->groups).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = (op->groups).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        goto LAB_013fd466;
      }
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar24);
      pBVar11 = BaseExpression::Cast<duckdb::BoundAggregateExpression>
                          (&pEVar10->super_BaseExpression);
      puVar24 = puVar24 + 1;
    } while (pBVar11->aggr_type != DISTINCT);
  }
LAB_013fd57a:
  if (((ulong)(((long)(op->grouping_sets).
                      super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                      .
                      super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(op->grouping_sets).
                     super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     .
                     super__Vector_base<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x30) < 2) &&
     ((op->grouping_functions).
      super_vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
      .
      super__Vector_base<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (op->grouping_functions).
      super_vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
      .
      super__Vector_base<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pCVar3 = this->context;
    this_00 = &op->group_stats;
    if ((op->group_stats).
        super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (op->group_stats).
        super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::
      vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ::resize(&this_00->
                super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
               ,(long)(op->groups).
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(op->groups).
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3);
    }
    local_148 = 0;
    local_138 = (PhysicalTableScan *)0x0;
    do {
      if ((ulong)((long)(op->groups).
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(op->groups).
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= local_148) {
        puVar24 = (op->super_LogicalOperator).expressions.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = (op->super_LogicalOperator).expressions.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        goto LAB_013fd944;
      }
      pvVar15 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>(__range1_1,local_148);
      this_02 = (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                 *)vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                   ::get<true>(this_00,local_148);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar15);
      if (7 < (byte)((pEVar10->return_type).physical_type_ - UINT8)) break;
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar15);
      if ((this_02->_M_t).
          super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
          .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl ==
          (BaseStatistics *)0x0) {
        if (3 < (byte)((pEVar10->return_type).physical_type_ - UINT8)) break;
        other = &pEVar10->return_type;
        LogicalType::LogicalType(&local_48,other);
        NumericStats::CreateUnknown((BaseStatistics *)&base_columns,&local_48);
        BaseStatistics::ToUnique((BaseStatistics *)&col_idx);
        uVar5 = col_idx;
        col_idx = 0;
        ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
        ::reset(this_02,(pointer)uVar5);
        ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
        ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                     *)&col_idx);
        BaseStatistics::~BaseStatistics((BaseStatistics *)&base_columns);
        LogicalType::~LogicalType(&local_48);
        pBVar16 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                               *)this_02);
        Value::MinimumValue((Value *)&base_columns,other);
        NumericStats::SetMin(pBVar16,(Value *)&base_columns);
        Value::~Value((Value *)&base_columns);
        pBVar16 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                               *)this_02);
        Value::MaximumValue((Value *)&base_columns,other);
        NumericStats::SetMax(pBVar16,(Value *)&base_columns);
        Value::~Value((Value *)&base_columns);
      }
      pBVar16 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                             *)this_02);
      bVar7 = NumericStats::HasMinMax(pBVar16);
      if (!bVar7) break;
      pBVar17 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                             *)this_02);
      NumericStats::Max((Value *)&base_columns,pBVar17);
      pBVar17 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                             *)this_02);
      NumericStats::Min((Value *)&col_idx,pBVar17);
      bVar7 = Value::operator<((Value *)&base_columns,(Value *)&col_idx);
      Value::~Value((Value *)&col_idx);
      Value::~Value((Value *)&base_columns);
      if (bVar7) break;
      result = &switchD_013fd857::switchdataD_01fe891c;
      switch((pEVar10->return_type).physical_type_) {
      case UINT8:
        hVar25 = GetRangeHugeint<unsigned_char>(pBVar16);
        break;
      case INT8:
        hVar25 = GetRangeHugeint<signed_char>(pBVar16);
        break;
      case UINT16:
        hVar25 = GetRangeHugeint<unsigned_short>(pBVar16);
        break;
      case INT16:
        hVar25 = GetRangeHugeint<short>(pBVar16);
        break;
      case UINT32:
        hVar25 = GetRangeHugeint<unsigned_int>(pBVar16);
        break;
      case INT32:
        hVar25 = GetRangeHugeint<int>(pBVar16);
        break;
      case UINT64:
        hVar25 = GetRangeHugeint<unsigned_long>(pBVar16);
        break;
      case INT64:
        hVar25 = GetRangeHugeint<long>(pBVar16);
        break;
      default:
        this_03 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&base_columns,
                   "Unsupported type for perfect hash (should be caught before)",
                   (allocator *)&col_idx);
        InternalException::InternalException(this_03,(string *)&base_columns);
        __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      input.upper = (int64_t)&base_columns;
      input.lower = hVar25.upper;
      bVar7 = Hugeint::TryCast<unsigned_long>((Hugeint *)hVar25.lower,input,(uint64_t *)result);
      if ((!bVar7) ||
         ((pointer)0x7ffffffe <
          base_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start)) break;
      col_idx = 0;
      base_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)base_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + 2);
      for (puVar18 = base_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; (uint)puVar18 != 0;
          puVar18 = (pointer)(ulong)((uint)puVar18 >> 1)) {
        col_idx = col_idx + 1;
      }
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&required_bits,&col_idx);
      uVar5 = col_idx;
      pCVar19 = ClientConfig::GetConfig(pCVar3);
      local_138 = (PhysicalTableScan *)
                  ((long)&(local_138->super_PhysicalOperator)._vptr_PhysicalOperator + uVar5);
      local_148 = local_148 + 1;
      if ((PhysicalTableScan *)pCVar19->perfect_ht_threshold < local_138) break;
    } while( true );
  }
LAB_013fd5a6:
  pPVar9 = Make<duckdb::PhysicalHashAggregate,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::vector<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,true>,duckdb::vector<duckdb::vector<unsigned_long,false>,true>,unsigned_long&>
                     (this,this->context,&(op->super_LogicalOperator).types,aggregates,__range1_1,
                      &op->grouping_sets,&op->grouping_functions,
                      &(op->super_LogicalOperator).estimated_cardinality);
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ::push_back(&(pPVar9->children).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              ,&local_140);
LAB_013fd5eb:
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&required_bits);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&partition_columns);
  return pPVar9;
LAB_013fd466:
  if (puVar24 == puVar4) goto LAB_013fd4a7;
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(puVar24);
  if ((pEVar10->super_BaseExpression).type != BOUND_REF) goto LAB_013fd57a;
  pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(puVar24);
  pBVar12 = BaseExpression::Cast<duckdb::BoundReferenceExpression>(&pEVar10->super_BaseExpression);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&partition_columns,
             &pBVar12->index);
  puVar24 = puVar24 + 1;
  goto LAB_013fd466;
LAB_013fd4a7:
  while( true ) {
    while (PVar1 = pPVar9->type, PVar1 == FILTER) {
      pvVar14 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                          (&pPVar9->children,0);
      pPVar9 = pvVar14->_M_data;
    }
    if (PVar1 != PROJECTION) break;
    pPVar13 = PhysicalOperator::Cast<duckdb::PhysicalProjection>(pPVar9);
    puVar18 = partition_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    base_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    base_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    base_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (puVar23 = partition_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar23 != puVar18; puVar23 = puVar23 + 1) {
      pvVar15 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>(&pPVar13->select_list,*puVar23);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar15);
      if ((pEVar10->super_BaseExpression).type != BOUND_REF) {
        ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&base_columns);
        goto LAB_013fd57a;
      }
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(pvVar15);
      pBVar12 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                          (&pEVar10->super_BaseExpression);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&base_columns,
                 &pBVar12->index);
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&partition_columns);
    pvVar14 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                        (&pPVar9->children,0);
    pPVar9 = pvVar14->_M_data;
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&base_columns);
  }
  if ((PVar1 == TABLE_SCAN) &&
     (pPVar20 = PhysicalOperator::Cast<duckdb::PhysicalTableScan>(pPVar9),
     puVar18 = partition_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,
     (pPVar20->function).get_partition_info != (table_function_get_partition_info_t)0x0)) {
    if ((pPVar20->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pPVar20->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      for (puVar23 = partition_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar23 != puVar18; puVar23 = puVar23 + 1) {
        pvVar21 = vector<unsigned_long,_true>::get<true>(&pPVar20->projection_ids,*puVar23);
        *puVar23 = *pvVar21;
      }
    }
    puVar18 = partition_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    base_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    base_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    base_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138 = pPVar20;
    for (puVar23 = partition_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar23 != puVar18; puVar23 = puVar23 + 1) {
      col_idx = *puVar23;
      pvVar22 = vector<duckdb::ColumnIndex,_true>::get<true>(&pPVar20->column_ids,col_idx);
      col_idx = pvVar22->index;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&base_columns,&col_idx);
    }
    col_idx = (unsigned_long)
              (local_138->bind_data).
              super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
              _M_t.
              super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
              .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    local_80 = (element_type *)&base_columns;
    TVar8 = (*(local_138->function).get_partition_info)
                      (pCVar3,(TableFunctionPartitionInput *)&col_idx);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&base_columns);
    if (TVar8 == SINGLE_VALUE_PARTITIONS) {
      pPVar9 = Make<duckdb::PhysicalPartitionedAggregate,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::vector<unsigned_long,true>,unsigned_long&>
                         (this,this->context,&(op->super_LogicalOperator).types,aggregates,
                          __range1_1,&partition_columns,
                          &(op->super_LogicalOperator).estimated_cardinality);
      ::std::
      vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ::push_back(&(pPVar9->children).
                   super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  ,&local_140);
      goto LAB_013fd5eb;
    }
  }
  goto LAB_013fd57a;
  while( true ) {
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar24);
    pBVar11 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&pEVar10->super_BaseExpression)
    ;
    if ((pBVar11->aggr_type == DISTINCT) ||
       (puVar24 = puVar24 + 1, (pBVar11->function).combine == (aggregate_combine_t)0x0)) break;
LAB_013fd944:
    if (puVar24 == puVar4) {
      pPVar9 = Make<duckdb::PhysicalPerfectHashAggregate,duckdb::ClientContext&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,true>,duckdb::vector<unsigned_long,true>,unsigned_long&>
                         (this,this->context,&(op->super_LogicalOperator).types,aggregates,
                          __range1_1,this_00,&required_bits,
                          &(op->super_LogicalOperator).estimated_cardinality);
      ::std::
      vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ::push_back(&(pPVar9->children).
                   super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                  ,&local_140);
      goto LAB_013fd5eb;
    }
  }
  goto LAB_013fd5a6;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalAggregate &op) {
	D_ASSERT(op.children.size() == 1);

	reference<PhysicalOperator> plan = CreatePlan(*op.children[0]);
	plan = ExtractAggregateExpressions(plan, op.expressions, op.groups);

	bool can_use_simple_aggregation = true;
	for (auto &expression : op.expressions) {
		auto &aggregate = expression->Cast<BoundAggregateExpression>();
		if (!aggregate.function.simple_update) {
			// unsupported aggregate for simple aggregation: use hash aggregation
			can_use_simple_aggregation = false;
			break;
		}
	}

	if (op.groups.empty() && op.grouping_sets.size() <= 1) {
		// no groups, check if we can use a simple aggregation
		// special case: aggregate entire columns together
		if (can_use_simple_aggregation) {
			auto &group_by =
			    Make<PhysicalUngroupedAggregate>(op.types, std::move(op.expressions), op.estimated_cardinality);
			group_by.children.push_back(plan);
			return group_by;
		}
		auto &group_by =
		    Make<PhysicalHashAggregate>(context, op.types, std::move(op.expressions), op.estimated_cardinality);
		group_by.children.push_back(plan);
		return group_by;
	}

	// groups! create a GROUP BY aggregator
	// use a partitioned or perfect hash aggregate if possible
	vector<column_t> partition_columns;
	vector<idx_t> required_bits;
	if (can_use_simple_aggregation && CanUsePartitionedAggregate(context, op, plan, partition_columns)) {
		auto &group_by =
		    Make<PhysicalPartitionedAggregate>(context, op.types, std::move(op.expressions), std::move(op.groups),
		                                       std::move(partition_columns), op.estimated_cardinality);
		group_by.children.push_back(plan);
		return group_by;
	}

	if (CanUsePerfectHashAggregate(context, op, required_bits)) {
		auto &group_by = Make<PhysicalPerfectHashAggregate>(context, op.types, std::move(op.expressions),
		                                                    std::move(op.groups), std::move(op.group_stats),
		                                                    std::move(required_bits), op.estimated_cardinality);
		group_by.children.push_back(plan);
		return group_by;
	}

	auto &group_by = Make<PhysicalHashAggregate>(context, op.types, std::move(op.expressions), std::move(op.groups),
	                                             std::move(op.grouping_sets), std::move(op.grouping_functions),
	                                             op.estimated_cardinality);
	group_by.children.push_back(plan);
	return group_by;
}